

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tostring.cc
# Opt level: O0

string * __thiscall re2::Regexp::ToString_abi_cxx11_(Regexp *this)

{
  bool bVar1;
  string *in_RDI;
  ToStringWalker w;
  string *t;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  string *this_00;
  Walker<int> local_38;
  byte local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  ToStringWalker::ToStringWalker
            ((ToStringWalker *)this_00,
             (string *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  Walker<int>::WalkExponential
            ((Walker<int> *)this_00,
             (Regexp *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),0,0x262359);
  bVar1 = Walker<int>::stopped_early(&local_38);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)in_RDI," [truncated]");
  }
  local_11 = 1;
  ToStringWalker::~ToStringWalker((ToStringWalker *)0x2623c3);
  if ((local_11 & 1) == 0) {
    std::__cxx11::string::~string((string *)in_RDI);
  }
  return this_00;
}

Assistant:

std::string Regexp::ToString() {
  std::string t;
  ToStringWalker w(&t);
  w.WalkExponential(this, PrecToplevel, 100000);
  if (w.stopped_early())
    t += " [truncated]";
  return t;
}